

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

void * arg_hashtable_search(arg_hashtable_t *h,void *k)

{
  arg_hashtable_entry *paVar1;
  uint uVar2;
  int iVar3;
  arg_hashtable_entry **ppaVar4;
  
  uVar2 = enhanced_hash(h,k);
  ppaVar4 = h->table + (ulong)uVar2 % (ulong)h->tablelength;
  while( true ) {
    paVar1 = *ppaVar4;
    if (paVar1 == (arg_hashtable_entry *)0x0) {
      return (void *)0x0;
    }
    if ((uVar2 == paVar1->h) && (iVar3 = (*h->eqfn)(k,paVar1->k), iVar3 != 0)) break;
    ppaVar4 = &paVar1->next;
  }
  return paVar1->v;
}

Assistant:

void* arg_hashtable_search(arg_hashtable_t* h, const void* k) {
    struct arg_hashtable_entry* e;
    unsigned int hashvalue;
    unsigned int index;

    hashvalue = enhanced_hash(h, k);
    index = index_for(h->tablelength, hashvalue);
    e = h->table[index];
    while (e != NULL) {
        /* Check hash value to short circuit heavier comparison */
        if ((hashvalue == e->h) && (h->eqfn(k, e->k)))
            return e->v;
        e = e->next;
    }
    return NULL;
}